

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu580.c
# Opt level: O0

MPP_RET hal_h265e_v580_start(void *hal,HalEncTask *enc_task)

{
  RK_U32 offset_00;
  H265eSyntax_new *syn_00;
  Vepu541Fmt *pVVar1;
  long lVar2;
  MppDevRegOffCfgs *pMVar3;
  uint uVar4;
  anon_struct_4_4_5bc86bfe_for_reg0200_src_udfu aVar5;
  anon_struct_4_4_5bc8e43d_for_reg0201_src_udfv aVar6;
  anon_struct_4_4_c09dc813_for_reg0197_src_fill aVar7;
  anon_struct_4_4_3b0f98d5_for_reg0196_enc_rsl aVar8;
  MPP_RET MVar9;
  size_t sVar10;
  Vepu580H265Fbk *fb;
  H265eV580StatusElem *pHStack_70;
  RK_U32 offset;
  H265eV580StatusElem *reg_out;
  hevc_vepu580_base *reg_base;
  H265eV580RegSet *hw_regs;
  RK_S32 tile_start_x;
  MPP_RET ret;
  RK_U32 k;
  Vepu580H265eFrmCfg *frm;
  VepuFmtCfg *fmt;
  RK_U32 stream_len;
  RK_U32 tile_num;
  H265eSyntax_new *syn;
  H265eV580HalContext *ctx;
  HalEncTask *enc_task_local;
  void *hal_local;
  
  syn_00 = *(H265eSyntax_new **)((long)hal + 0xd0);
  uVar4 = ((syn_00->pp).num_tile_columns_minus1 + 1) * ((syn_00->pp).num_tile_rows_minus1 + 1);
  fmt._0_4_ = 0;
  pVVar1 = *(Vepu541Fmt **)((long)hal + 0x110);
  lVar2 = *(long *)((long)hal + 0x80);
  hw_regs._4_4_ = 0;
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","(%d) enter\n",(char *)0x0,0xb46);
  }
  *(uint *)((long)hal + 0xe8) = uVar4;
  if ((enc_task->flags).err == 0) {
    if (uVar4 < 5) {
      for (tile_start_x = 0; (uint)tile_start_x < uVar4; tile_start_x = tile_start_x + 1) {
        reg_base = *(hevc_vepu580_base **)(lVar2 + 0x18 + (ulong)(uint)tile_start_x * 8);
        pHStack_70 = *(H265eV580StatusElem **)(lVar2 + 0x38 + (ulong)(uint)tile_start_x * 8);
        if (reg_base == (hevc_vepu580_base *)0x0) {
          reg_base = (hevc_vepu580_base *)mpp_osal_malloc("hal_h265e_v580_start",0x1d08);
          *(hevc_vepu580_base **)(lVar2 + 0x18 + (ulong)(uint)tile_start_x * 8) = reg_base;
        }
        if (pHStack_70 == (H265eV580StatusElem *)0x0) {
          pHStack_70 = (H265eV580StatusElem *)mpp_osal_malloc("hal_h265e_v580_start",0x2d4);
          *(H265eV580StatusElem **)(lVar2 + 0x38 + (ulong)(uint)tile_start_x * 8) = pHStack_70;
        }
        if (tile_start_x != 0) {
          memcpy(reg_base,*(void **)(lVar2 + 0x18),0x1d08);
        }
        vepu580_h265_set_me_ram
                  (syn_00,(hevc_vepu580_base *)reg_base->reserved184_191,tile_start_x,hw_regs._4_4_)
        ;
        vepu580_h265_set_patch_info(*(MppDevRegOffCfgs **)(lVar2 + 0x218),syn_00,*pVVar1,enc_task);
        if (1 < uVar4) {
          hal_h265e_v580_set_uniform_tile
                    ((hevc_vepu580_base *)reg_base->reserved184_191,syn_00,tile_start_x,
                     hw_regs._4_4_);
        }
        if (tile_start_x != 0) {
          aVar5 = (anon_struct_4_4_5bc86bfe_for_reg0200_src_udfu)
                  mpp_buffer_get_fd_with_caller
                            (*(MppBuffer *)(lVar2 + 400 + (ulong)(uint)tile_start_x * 8),
                             "hal_h265e_v580_start");
          reg_base->reg0200_src_udfu = aVar5;
          aVar6 = (anon_struct_4_4_5bc8e43d_for_reg0201_src_udfv)
                  mpp_buffer_get_fd_with_caller
                            (*(MppBuffer *)(lVar2 + 400 + (ulong)(tile_start_x - 1) * 8),
                             "hal_h265e_v580_start");
          reg_base->reg0201_src_udfv = aVar6;
          if (*(int *)((long)hal + 0xec) == 0) {
            sVar10 = mpp_packet_get_length(enc_task->packet);
            aVar7 = (anon_struct_4_4_c09dc813_for_reg0197_src_fill)
                    mpp_buffer_get_fd_with_caller(enc_task->output,"hal_h265e_v580_start");
            reg_base->reg0197_src_fill = aVar7;
            mpp_dev_multi_offset_update
                      (*(MppDevRegOffCfgs **)(lVar2 + 0x218),0xaf,(int)fmt + (int)sVar10);
            pMVar3 = *(MppDevRegOffCfgs **)(lVar2 + 0x218);
            sVar10 = mpp_buffer_get_size_with_caller(enc_task->output,"hal_h265e_v580_start");
            mpp_dev_multi_offset_update(pMVar3,0xac,(RK_U32)sVar10);
          }
          else {
            aVar8 = (anon_struct_4_4_3b0f98d5_for_reg0196_enc_rsl)
                    mpp_buffer_get_fd_with_caller
                              (*(MppBuffer *)(lVar2 + 0x1b0 + (ulong)(tile_start_x - 1) * 8),
                               "hal_h265e_v580_start");
            reg_base->reg0196_enc_rsl = aVar8;
            reg_base->reg0197_src_fill =
                 (anon_struct_4_4_c09dc813_for_reg0197_src_fill)reg_base->reg0196_enc_rsl;
            reg_base->reg0198_src_fmt =
                 (anon_struct_4_6_4b431ccf_for_reg0198_src_fmt)reg_base->reg0196_enc_rsl;
            reg_base->reg0199_src_udfy =
                 (anon_struct_4_4_5bca4cfa_for_reg0199_src_udfy)reg_base->reg0196_enc_rsl;
            mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)(lVar2 + 0x218),0xaf,0);
            pMVar3 = *(MppDevRegOffCfgs **)(lVar2 + 0x218);
            sVar10 = mpp_buffer_get_size_with_caller
                               (*(MppBuffer *)(lVar2 + 0x1b0 + (ulong)(tile_start_x - 1) * 8),
                                "hal_h265e_v580_start");
            mpp_dev_multi_offset_update(pMVar3,0xac,(RK_U32)sVar10);
          }
          offset_00 = *(RK_U32 *)((long)hal + 0x138);
          mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)(lVar2 + 0x218),0xa6,offset_00);
          mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)(lVar2 + 0x218),0xa4,offset_00);
        }
        if (((enc_task->rc_task->frm).val >> 2 & 1) != 0) {
          vepu580_h265e_save_pass1_patch
                    ((H265eV580RegSet *)reg_base,(H265eV580HalContext *)hal,
                     (syn_00->pp).field_22.CodingSettingPicturePropertyFlags >> 7 & 1);
        }
        if (((enc_task->rc_task->frm).val >> 3 & 1) != 0) {
          vepu580_h265e_use_pass1_patch((H265eV580RegSet *)reg_base,(H265eV580HalContext *)hal);
        }
        hal_h265e_v580_send_regs
                  (*(MppDev *)((long)hal + 0x68),(H265eV580RegSet *)reg_base,pHStack_70);
        mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),7,*(void **)(lVar2 + 0x218));
        if ((uint)tile_start_x < uVar4 - 1) {
          if (*(int *)((long)hal + 0xec) == 0) {
            MVar9 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0xf,(void *)0x0);
            if (MVar9 != MPP_OK) {
              _mpp_log_l(2,"hal_h265e_v580","send cmd failed %d\n","hal_h265e_v580_start",
                         (ulong)(uint)MVar9);
            }
            MVar9 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0x10,(void *)0x0);
            if (MVar9 != MPP_OK) {
              _mpp_log_l(2,"hal_h265e_v580","poll cmd failed %d\n","hal_h265e_v580_start",
                         (ulong)(uint)MVar9);
            }
            fmt._0_4_ = (pHStack_70->st).bs_lgth_l32 + (int)fmt;
            *(RK_U32 *)(lVar2 + 0x5c) = (pHStack_70->st).qp_sum + *(int *)(lVar2 + 0x5c);
            *(RK_U32 *)(lVar2 + 0x60) = (pHStack_70->st).bs_lgth_l32 + *(int *)(lVar2 + 0x60);
            *(ulong *)(lVar2 + 0x68) =
                 (ulong)((pHStack_70->st).sse_h32 << 0x10) +
                 (long)(int)((uint)(pHStack_70->st).st_sse_bsl >> 0x10) + *(long *)(lVar2 + 0x68);
            *(RK_U32 *)(lVar2 + 0x164) = (pHStack_70->st).madi + *(int *)(lVar2 + 0x164);
            *(RK_U32 *)(lVar2 + 0x160) = (pHStack_70->st).madp + *(int *)(lVar2 + 0x160);
            *(uint *)(lVar2 + 0x188) =
                 ((uint)(pHStack_70->st).st_bnum_b16 & 0x7fffff) + *(int *)(lVar2 + 0x188);
            *(uint *)(lVar2 + 0x18c) =
                 ((uint)(pHStack_70->st).st_bnum_cme & 0x1fffff) + *(int *)(lVar2 + 0x18c);
          }
          else {
            mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),2,(void *)0x0);
          }
        }
        hw_regs._4_4_ = (syn_00->pp).column_width_minus1[(uint)tile_start_x] + 1 + hw_regs._4_4_;
      }
      hal_local._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0xf,(void *)0x0);
      if (hal_local._4_4_ != MPP_OK) {
        _mpp_log_l(2,"hal_h265e_v580","send cmd failed %d\n","hal_h265e_v580_start",
                   (ulong)(uint)hal_local._4_4_);
      }
      if ((hal_h265e_debug & 4) != 0) {
        _mpp_log_l(4,"hal_h265e_v580","(%d) leave\n",(char *)0x0,0xbb9);
      }
    }
    else {
      _mpp_log_l(4,"hal_h265e_v580","tile_num big then support %d, max %d",(char *)0x0,(ulong)uVar4)
      ;
      hal_local._4_4_ = MPP_NOK;
    }
  }
  else {
    _mpp_log_l(2,"hal_h265e_v580","enc_task->flags.err %08x, return e arly","hal_h265e_v580_start",
               (ulong)(enc_task->flags).err);
    hal_local._4_4_ = MPP_NOK;
  }
  return hal_local._4_4_;
}

Assistant:

MPP_RET hal_h265e_v580_start(void *hal, HalEncTask *enc_task)
{
    H265eV580HalContext *ctx = (H265eV580HalContext *)hal;
    H265eSyntax_new *syn = ctx->syn;
    RK_U32 tile_num = (syn->pp.num_tile_columns_minus1 + 1) * (syn->pp.num_tile_rows_minus1 + 1);
    RK_U32 stream_len = 0;
    VepuFmtCfg *fmt = (VepuFmtCfg *)ctx->input_fmt;
    Vepu580H265eFrmCfg *frm = ctx->frm;
    RK_U32 k = 0;
    MPP_RET ret = MPP_OK;
    RK_S32 tile_start_x = 0;

    hal_h265e_enter();

    ctx->tile_num = tile_num;

    if (enc_task->flags.err) {
        hal_h265e_err("enc_task->flags.err %08x, return e arly",
                      enc_task->flags.err);
        return MPP_NOK;
    }

    if (tile_num > MAX_TILE_NUM) {
        mpp_log("tile_num big then support %d, max %d", tile_num, MAX_TILE_NUM);
        return MPP_NOK;
    }

    for (k = 0; k < tile_num; k++) {
        H265eV580RegSet *hw_regs = frm->regs_set[k];
        hevc_vepu580_base *reg_base = NULL;
        H265eV580StatusElem *reg_out = frm->regs_ret[k];

        if (!hw_regs) {
            hw_regs = mpp_malloc(H265eV580RegSet, 1);
            frm->regs_set[k] = hw_regs;
        }
        if (!reg_out) {
            reg_out = mpp_malloc(H265eV580StatusElem, 1);
            frm->regs_ret[k] = reg_out;
        }

        reg_base = &hw_regs->reg_base;

        if (k)
            memcpy(hw_regs, frm->regs_set[0], sizeof(*hw_regs));

        vepu580_h265_set_me_ram(syn, reg_base, k, tile_start_x);

        /* set input info */
        vepu580_h265_set_patch_info(frm->reg_cfg, syn, (Vepu541Fmt)fmt->format, enc_task);
        if (tile_num > 1)
            hal_h265e_v580_set_uniform_tile(reg_base, syn, k, tile_start_x);

        if (k) {
            RK_U32 offset = 0;

            reg_base->reg0176_lpfw_addr  = mpp_buffer_get_fd(frm->hw_tile_buf[k]);
            reg_base->reg0177_lpfr_addr  = mpp_buffer_get_fd(frm->hw_tile_buf[k - 1]);

            if (!ctx->tile_parall_en) {
                offset = mpp_packet_get_length(enc_task->packet);
                offset += stream_len;

                reg_base->reg0173_bsbb_addr = mpp_buffer_get_fd(enc_task->output);

                mpp_dev_multi_offset_update(frm->reg_cfg, 175, offset);
                mpp_dev_multi_offset_update(frm->reg_cfg, 172, mpp_buffer_get_size(enc_task->output));
            } else {
                reg_base->reg0172_bsbt_addr = mpp_buffer_get_fd(frm->hw_tile_stream[k - 1]);
                /* TODO: stream size relative with syntax */
                reg_base->reg0173_bsbb_addr = reg_base->reg0172_bsbt_addr;
                reg_base->reg0174_bsbr_addr = reg_base->reg0172_bsbt_addr;
                reg_base->reg0175_adr_bsbs  = reg_base->reg0172_bsbt_addr;

                mpp_dev_multi_offset_update(frm->reg_cfg, 175, 0);
                mpp_dev_multi_offset_update(frm->reg_cfg, 172, mpp_buffer_get_size(frm->hw_tile_stream[k - 1]));
            }

            offset = ctx->fbc_header_len;

            mpp_dev_multi_offset_update(frm->reg_cfg, 166, offset);
            mpp_dev_multi_offset_update(frm->reg_cfg, 164, offset);
        }

        if (enc_task->rc_task->frm.save_pass1)
            vepu580_h265e_save_pass1_patch(hw_regs, ctx, syn->pp.tiles_enabled_flag);

        if (enc_task->rc_task->frm.use_pass1)
            vepu580_h265e_use_pass1_patch(hw_regs, ctx);

        hal_h265e_v580_send_regs(ctx->dev, hw_regs, reg_out);

        mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_OFFS, frm->reg_cfg);

        if (k < tile_num - 1) {
            if (!ctx->tile_parall_en) {
                Vepu580H265Fbk *fb = &frm->feedback;

                ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
                if (ret) {
                    mpp_err_f("send cmd failed %d\n", ret);
                }

                ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
                if (ret) {
                    mpp_err_f("poll cmd failed %d\n", ret);
                    ret = MPP_ERR_VPUHW;
                }
                stream_len += reg_out->st.bs_lgth_l32;
                fb->qp_sum += reg_out->st.qp_sum;
                fb->out_strm_size += reg_out->st.bs_lgth_l32;
                fb->sse_sum += (RK_S64)(reg_out->st.sse_h32 << 16) +
                               (reg_out->st.st_sse_bsl.sse_l16 & 0xffff);
                fb->st_madi += reg_out->st.madi;
                fb->st_madp += reg_out->st.madp;
                fb->st_mb_num += reg_out->st.st_bnum_b16.num_b16;
                fb->st_ctu_num += reg_out->st.st_bnum_cme.num_ctu;
            } else
                mpp_dev_ioctl(ctx->dev, MPP_DEV_DELIMIT, NULL);
        }
        tile_start_x += (syn->pp.column_width_minus1[k] + 1);
    }

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
    if (ret) {
        mpp_err_f("send cmd failed %d\n", ret);
    }
    hal_h265e_leave();
    return ret;
}